

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_https.hpp
# Opt level: O0

int __thiscall
SimpleWeb::
Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
connect(Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
        *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  element_type *this_00;
  element_type *peVar3;
  pointer this_01;
  lowest_layer_type *this_02;
  element_type *resolver_00;
  type host_port;
  undefined4 in_register_0000000c;
  void *__buf;
  undefined4 in_register_00000034;
  anon_class_40_3_55bd203b local_60;
  undefined1 local_28 [8];
  shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>_> resolver;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
  *session_local;
  Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  ssize_t sVar4;
  
  resolver.
  super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000034,__fd);
  this_00 = std::
            __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)resolver.
                            super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
  peVar3 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  this_01 = std::
            unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
            ::operator->(&peVar3->socket);
  this_02 = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
            lowest_layer(this_01);
  bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open(this_02);
  if (bVar1) {
    sVar4 = ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
            ::write(&this->
                     super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                    ,(int)resolver.
                          super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi,__buf,CONCAT44(in_register_0000000c,__len));
    iVar2 = (int)sVar4;
  }
  else {
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &(this->
                super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                ).io_service);
    std::
    make_shared<asio::ip::basic_resolver<asio::ip::tcp,asio::any_io_executor>,asio::io_context&>
              ((io_context *)local_28);
    resolver_00 = std::
                  __shared_ptr_access<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
    host_port = std::
                unique_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&(this->
                             super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                             ).host_port);
    local_60.this = this;
    std::
    shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
    ::shared_ptr(&local_60.session,
                 (shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
                  *)resolver.
                    super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    std::shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>_>::shared_ptr
              (&local_60.resolver,
               (shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>_> *)
               local_28);
    async_resolve<SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::connect(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Session>const&)::_lambda(std::error_code_const&,asio::ip::basic_resolver_results<asio::ip::tcp>)_1_>
              (resolver_00,host_port,&local_60);
    Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::
    connect(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Session>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_results<asio::ip::tcp>)#1}::
    ~basic_resolver_results
              ((_lambda_std__error_code_const__asio__ip__basic_resolver_results<asio::ip::tcp>__1_ *
               )&local_60);
    std::shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>_>::~shared_ptr
              ((shared_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>_> *)
               local_28);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void connect(const std::shared_ptr<Session> &session) override {
      if(!session->connection->socket->lowest_layer().is_open()) {
        auto resolver = std::make_shared<asio::ip::tcp::resolver>(*io_service);
        async_resolve(*resolver, *host_port, [this, session, resolver](const error_code &ec, resolver_results results) {
          auto lock = session->connection->handler_runner->continue_lock();
          if(!lock)
            return;
          if(!ec) {
            session->connection->set_timeout(this->config.timeout_connect);
            asio::async_connect(session->connection->socket->lowest_layer(), results, [this, session, resolver](const error_code &ec, async_connect_endpoint /*endpoint*/) {
              session->connection->cancel_timeout();
              auto lock = session->connection->handler_runner->continue_lock();
              if(!lock)
                return;
              if(!ec) {
                asio::ip::tcp::no_delay option(true);
                error_code ec;
                session->connection->socket->lowest_layer().set_option(option, ec);

                if(!this->config.proxy_server.empty()) {
                  auto write_buffer = std::make_shared<asio::streambuf>();
                  std::ostream write_stream(write_buffer.get());
                  auto host_port = this->host + ':' + std::to_string(this->port);
                  write_stream << "CONNECT " + host_port + " HTTP/1.1\r\n"
                               << "Host: " << host_port << "\r\n\r\n";
                  session->connection->set_timeout(this->config.timeout_connect);
                  asio::async_write(session->connection->socket->next_layer(), *write_buffer, [this, session, write_buffer](const error_code &ec, std::size_t /*bytes_transferred*/) {
                    session->connection->cancel_timeout();
                    auto lock = session->connection->handler_runner->continue_lock();
                    if(!lock)
                      return;
                    if(!ec) {
                      std::shared_ptr<Response> response(new Response(this->config.max_response_streambuf_size, session->connection));
                      session->connection->set_timeout(this->config.timeout_connect);
                      asio::async_read_until(session->connection->socket->next_layer(), response->streambuf, "\r\n\r\n", [this, session, response](const error_code &ec, std::size_t /*bytes_transferred*/) {
                        session->connection->cancel_timeout();
                        auto lock = session->connection->handler_runner->continue_lock();
                        if(!lock)
                          return;
                        if(response->streambuf.size() == response->streambuf.max_size()) {
                          session->callback(make_error_code::make_error_code(errc::message_size));
                          return;
                        }

                        if(!ec) {
                          if(!ResponseMessage::parse(response->content, response->http_version, response->status_code, response->header))
                            session->callback(make_error_code::make_error_code(errc::protocol_error));
                          else {
                            if(response->status_code.compare(0, 3, "200") != 0)
                              session->callback(make_error_code::make_error_code(errc::permission_denied));
                            else
                              this->handshake(session);
                          }
                        }
                        else
                          session->callback(ec);
                      });
                    }
                    else
                      session->callback(ec);
                  });
                }
                else
                  this->handshake(session);
              }
              else
                session->callback(ec);
            });
          }
          else
            session->callback(ec);
        });
      }
      else
        write(session);
    }